

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buttons.cpp
# Opt level: O2

void __thiscall GPIO::Switch::triggered(Switch *this,uint gpio)

{
  bool bVar1;
  long lVar2;
  
  bVar1 = DigitalIn::debounce(&this->m_pin);
  if (!bVar1) {
    return;
  }
  if ((this->m_pin).m_state == false) {
    lVar2 = 0x88;
    if ((this->f_off).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0010db19;
  }
  else {
    if ((this->f_on).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_0010db19;
    lVar2 = 0x68;
  }
  std::function<void_()>::operator()
            ((function<void_()> *)
             ((long)&(this->super_InputDetect).super_ObjectBase._vptr_ObjectBase + lVar2));
LAB_0010db19:
  if ((this->f_switched).super__Function_base._M_manager == (_Manager_type)0x0) {
    return;
  }
  std::function<void_(bool)>::operator()(&this->f_switched,(this->m_pin).m_state);
  return;
}

Assistant:

void Switch::triggered(unsigned int gpio)
{
    // check if this is really a new event, or still a bouncing switch

    if (!m_pin.triggered()) return;
    
    // now call the virtual functions to trigger some action

    switch (m_pin.get_state()) {
        case false:
            if (f_off) f_off();
            break;

        case true:
            if (f_on) f_on();
            break;
    }
    
    if (f_switched) f_switched(m_pin.get_state());
}